

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O1

Expression * __thiscall
wasm::SExpressionWasmBuilder::makeArrayFill(SExpressionWasmBuilder *this,Element *s)

{
  Element *pEVar1;
  HeapType heapType;
  Expression *child;
  Expression *pEVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  ArrayFill *this_00;
  SExpressionWasmBuilder *this_01;
  
  pEVar1 = Element::operator[](s,1);
  heapType = parseHeapType(this,pEVar1);
  pEVar1 = Element::operator[](s,2);
  this_01 = this;
  child = parseExpression(this,pEVar1);
  validateHeapTypeUsingChild(this_01,child,heapType,s);
  pEVar1 = Element::operator[](s,3);
  pEVar2 = parseExpression(this,pEVar1);
  pEVar1 = Element::operator[](s,4);
  pEVar3 = parseExpression(this,pEVar1);
  pEVar1 = Element::operator[](s,5);
  pEVar4 = parseExpression(this,pEVar1);
  this_00 = (ArrayFill *)MixedArena::allocSpace(&this->wasm->allocator,0x30,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression._id = ArrayFillId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.type.id = 0;
  this_00->ref = child;
  this_00->index = pEVar2;
  this_00->value = pEVar3;
  this_00->size = pEVar4;
  ArrayFill::finalize(this_00);
  return (Expression *)this_00;
}

Assistant:

Expression* SExpressionWasmBuilder::makeArrayFill(Element& s) {
  auto heapType = parseHeapType(*s[1]);
  auto ref = parseExpression(*s[2]);
  validateHeapTypeUsingChild(ref, heapType, s);
  auto index = parseExpression(*s[3]);
  auto value = parseExpression(*s[4]);
  auto size = parseExpression(*s[5]);
  return Builder(wasm).makeArrayFill(ref, index, value, size);
}